

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gems.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  TimeOrder TVar2;
  size_type __n;
  Diamond *this;
  reference this_00;
  reference this_01;
  pointer this_02;
  ostream *poVar3;
  unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_> *d;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  *__range2;
  int is_forever;
  int local_78;
  allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_> local_71;
  int i;
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  bling;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  char **ppcStack_18;
  int n;
  char **argv_local;
  int argc_local;
  
  local_1c = 10;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  if (1 < argc) {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
    bVar1 = std::operator==(&local_40,"-h");
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Usage:");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cerr,"\t");
      poVar3 = std::operator<<(poVar3,*ppcStack_18);
      poVar3 = std::operator<<(poVar3," [N]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Options:");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cerr,"\tN\t\tNumber of diamonds [default: 10]");
      std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    local_1c = atoi(ppcStack_18[1]);
  }
  __n = (size_type)local_1c;
  std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>::allocator
            (&local_71);
  std::
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  ::vector((vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
            *)&i,__n,&local_71);
  std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>::~allocator
            (&local_71);
  for (local_78 = 0; local_78 < local_1c; local_78 = local_78 + 1) {
    this = (Diamond *)operator_new(4);
    gems::Diamond::Diamond(this);
    std::unique_ptr<gems::Diamond,std::default_delete<gems::Diamond>>::
    unique_ptr<std::default_delete<gems::Diamond>,void>
              ((unique_ptr<gems::Diamond,std::default_delete<gems::Diamond>> *)
               &stack0xffffffffffffff80,this);
    this_00 = std::
              vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
              ::operator[]((vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                            *)&i,(long)local_78);
    std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>::operator=
              (this_00,(unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_> *)
                       &stack0xffffffffffffff80);
    std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>::~unique_ptr
              ((unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_> *)
               &stack0xffffffffffffff80);
  }
  __range2._4_4_ = 0;
  __end2 = std::
           vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
           ::begin((vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
                    *)&i);
  d = (unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_> *)
      std::
      vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
      ::end((vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
             *)&i);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_*,_std::vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>_>
                                     *)&d), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_*,_std::vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>_>
              ::operator*(&__end2);
    this_02 = std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>::operator->
                        (this_01);
    TVar2 = gems::Diamond::get_lifespan(this_02);
    __range2._4_4_ = (uint)(TVar2 == FOREVER) + __range2._4_4_;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_*,_std::vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>_>
    ::operator++(&__end2);
  }
  if (__range2._4_4_ == local_1c) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1c);
    poVar3 = std::operator<<(poVar3," diamonds are forever");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Looks ike cubic zirconium to me");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = 0;
  std::
  vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
  ::~vector((vector<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>,_std::allocator<std::unique_ptr<gems::Diamond,_std::default_delete<gems::Diamond>_>_>_>
             *)&i);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
    {
        int n = 10;
        if(argc > 1) {
            if(std::string(argv[1]) == "-h") {
                std::cerr << "Usage:" << std::endl;
                std::cerr << "\t" << argv[0] << " [N]" << std::endl;
                std::cerr << std::endl;
                std::cerr << "Options:" << std::endl;
                std::cerr << "\tN\t\tNumber of diamonds [default: 10]";
                std::cerr << std::endl;
                return 0;
            }
            n = std::atoi(argv[1]);
        }

        std::vector<std::unique_ptr<Diamond>> bling(n);
        for(int i = 0; i < n; i++) {
            bling[i] = std::unique_ptr<Diamond>(new Diamond());
        }

        int is_forever = 0;
        for(auto &d : bling) {
            is_forever += int(d->get_lifespan() == FOREVER);
        }

        if(is_forever == n) {
            std::cout << n << " diamonds are forever" << std::endl;
        }
        else {
            std::cout << "Looks ike cubic zirconium to me" << std::endl;
        }

        return 0;
    }